

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.c
# Opt level: O2

size_t cmsysBase64_Encode(uchar *input,size_t length,uchar *output,int mark_end)

{
  uchar *dest;
  
  dest = output;
  for (; 2 < (long)length; length = length - 3) {
    cmsysBase64_Encode3(input,dest);
    input = input + 3;
    dest = dest + 4;
  }
  if (length == 1) {
    cmsysBase64_Encode1(input,dest);
  }
  else if (length == 2) {
    cmsysBase64_Encode2(input,dest);
  }
  else {
    if (mark_end == 0) goto LAB_0035ed9d;
    builtin_memcpy(dest,"====",4);
  }
  dest = dest + 4;
LAB_0035ed9d:
  return (long)dest - (long)output;
}

Assistant:

size_t kwsysBase64_Encode(const unsigned char* input, size_t length,
                          unsigned char* output, int mark_end)
{
  const unsigned char* ptr = input;
  const unsigned char* end = input + length;
  unsigned char* optr = output;

  /* Encode complete triplet */

  while ((end - ptr) >= 3) {
    kwsysBase64_Encode3(ptr, optr);
    ptr += 3;
    optr += 4;
  }

  /* Encodes a 2-byte ending into 3 bytes and 1 pad byte and writes. */

  if (end - ptr == 2) {
    kwsysBase64_Encode2(ptr, optr);
    optr += 4;
  }

  /* Encodes a 1-byte ending into 2 bytes and 2 pad bytes */

  else if (end - ptr == 1) {
    kwsysBase64_Encode1(ptr, optr);
    optr += 4;
  }

  /* Do we need to mark the end */

  else if (mark_end) {
    optr[0] = optr[1] = optr[2] = optr[3] = '=';
    optr += 4;
  }

  return (size_t)(optr - output);
}